

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

CompilationStatus * __thiscall
gl3cts::ClipDistance::Utility::Program::compileShader
          (CompilationStatus *__return_storage_ptr__,Program *this,GLenum shader_type,
          GLchar **shader_code)

{
  GLint GVar1;
  uint in_EAX;
  GLuint GVar2;
  GLenum GVar3;
  GLchar *__s;
  ulong __n;
  uint uStack_38;
  GLint log_size;
  
  __return_storage_ptr__->shader_id = 0;
  __return_storage_ptr__->shader_compilation_status = 0;
  uStack_38 = in_EAX;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__return_storage_ptr__->shader_log,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)((long)register0x00000020 + -0x35));
  if (shader_code != (GLchar **)0x0) {
    GVar2 = (*this->m_gl->createShader)(shader_type);
    __return_storage_ptr__->shader_id = GVar2;
    GVar3 = (*this->m_gl->getError)();
    glu::checkError(GVar3,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x500);
    (*this->m_gl->shaderSource)(__return_storage_ptr__->shader_id,1,shader_code,(GLint *)0x0);
    GVar3 = (*this->m_gl->getError)();
    glu::checkError(GVar3,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x505);
    (*this->m_gl->compileShader)(__return_storage_ptr__->shader_id);
    GVar3 = (*this->m_gl->getError)();
    glu::checkError(GVar3,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x509);
    (*this->m_gl->getShaderiv)
              (__return_storage_ptr__->shader_id,0x8b81,
               &__return_storage_ptr__->shader_compilation_status);
    GVar3 = (*this->m_gl->getError)();
    glu::checkError(GVar3,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x50e);
    if (__return_storage_ptr__->shader_compilation_status == 0) {
      _uStack_38 = (ulong)uStack_38;
      (*this->m_gl->getShaderiv)(__return_storage_ptr__->shader_id,0x8b84,&log_size);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x517);
      GVar1 = log_size;
      __n = (ulong)log_size;
      if (__n != 0) {
        __s = (GLchar *)operator_new__(__n);
        memset(__s,0,__n);
        (*this->m_gl->getShaderInfoLog)(__return_storage_ptr__->shader_id,GVar1,(GLsizei *)0x0,__s);
        std::__cxx11::string::assign((char *)&__return_storage_ptr__->shader_log);
        operator_delete__(__s);
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glGetShaderInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                        ,0x527);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::CompilationStatus gl3cts::ClipDistance::Utility::Program::compileShader(
	const glw::GLenum shader_type, const glw::GLchar* const* shader_code)
{
	CompilationStatus shader = { 0, GL_NONE, "" };

	if (shader_code != DE_NULL)
	{
		try
		{
			/* Creation */
			shader.shader_id = m_gl.createShader(shader_type);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateShader() call failed.");

			/* Compilation */
			m_gl.shaderSource(shader.shader_id, 1, shader_code, NULL);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glShaderSource() call failed.");

			m_gl.compileShader(shader.shader_id);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCompileShader() call failed.");

			/* Status */
			m_gl.getShaderiv(shader.shader_id, GL_COMPILE_STATUS, &shader.shader_compilation_status);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv() call failed.");

			/* Logging */
			if (shader.shader_compilation_status == GL_FALSE)
			{
				glw::GLint log_size = 0;

				m_gl.getShaderiv(shader.shader_id, GL_INFO_LOG_LENGTH, &log_size);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv() call failed.");

				if (log_size)
				{
					glw::GLchar* log = new glw::GLchar[log_size];

					if (log)
					{
						memset(log, 0, log_size);

						m_gl.getShaderInfoLog(shader.shader_id, log_size, DE_NULL, log);

						shader.shader_log = log;

						delete[] log;

						GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderInfoLog() call failed.");
					}
				}
			}
		}
		catch (...)
		{
			if (shader.shader_id)
			{
				m_gl.deleteShader(shader.shader_id);

				shader.shader_id = 0;
			}
		}
	}

	return shader;
}